

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

uint32_t helper_bcdsub_ppc(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  ppc_avr_t bcopy;
  ppc_avr_t local_18;
  
  local_18.u64[0] = b->u64[0];
  local_18.u64[1] = b->u64[1];
  uVar2 = b->u8[0] & 0xf;
  if (uVar2 < 0x10) {
    if ((0xd400U >> uVar2 & 1) == 0) {
      if ((0x2800U >> uVar2 & 1) == 0) goto LAB_00955136;
      bVar1 = local_18.u8[0] & 0xf0 | 0xc;
    }
    else {
      bVar1 = local_18.u8[0] & 0xf0 | 0xd;
    }
    local_18.u64[0]._1_7_ = (undefined7)(local_18.u64[0] >> 8);
    local_18.u8[0] = bVar1;
  }
LAB_00955136:
  uVar3 = helper_bcdadd_ppc(r,a,&local_18,ps);
  return uVar3;
}

Assistant:

uint32_t helper_bcdsub(ppc_avr_t *r,  ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    ppc_avr_t bcopy = *b;
    int sgnb = bcd_get_sgn(b);
    if (sgnb < 0) {
        bcd_put_digit(&bcopy, BCD_PLUS_PREF_1, 0);
    } else if (sgnb > 0) {
        bcd_put_digit(&bcopy, BCD_NEG_PREF, 0);
    }
    /* else invalid ... defer to bcdadd code for proper handling */

    return helper_bcdadd(r, a, &bcopy, ps);
}